

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O2

SinkFinalizeType __thiscall
duckdb::PhysicalBatchCopyToFile::FinalFlush
          (PhysicalBatchCopyToFile *this,ClientContext *context,GlobalSinkState *gstate_p)

{
  copy_to_finalize_t p_Var1;
  idx_t iVar2;
  type pFVar3;
  type pGVar4;
  InternalException *pIVar5;
  allocator local_51;
  string local_50;
  
  iVar2 = BatchTaskManager<duckdb::BatchCopyTask>::TaskCount
                    ((BatchTaskManager<duckdb::BatchCopyTask> *)
                     ((long)&gstate_p[2].super_StateWithBlockableTasks.lock.super___mutex_base.
                             _M_mutex + 0x10));
  if (iVar2 != 0) {
    pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,
               "Unexecuted tasks are remaining in PhysicalFixedBatchCopy::FinalFlush!?",&local_51);
    InternalException::InternalException(pIVar5,&local_50);
    __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  FlushBatchData(this,context,gstate_p);
  if (*(long *)&gstate_p[6].super_StateWithBlockableTasks ==
      gstate_p[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align) {
    p_Var1 = (this->function).copy_to_finalize;
    if ((p_Var1 != (copy_to_finalize_t)0x0) &&
       (gstate_p[4].super_StateWithBlockableTasks.blocked_tasks.
        super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
        super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
      pFVar3 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
               operator*(&this->bind_data);
      pGVar4 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
               ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                            *)&gstate_p[4].super_StateWithBlockableTasks.blocked_tasks.
                               super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                               .
                               super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      (*p_Var1)(context,pFVar3,pGVar4);
      if (this->use_tmp_file == true) {
        PhysicalCopyToFile::MoveTmpFile(context,&this->file_path);
      }
    }
    BatchMemoryManager::FinalCheck((BatchMemoryManager *)(gstate_p + 1));
    return READY;
  }
  pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Not all batches were flushed to disk - incomplete file?",&local_51
            );
  InternalException::InternalException(pIVar5,&local_50);
  __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SinkFinalizeType PhysicalBatchCopyToFile::FinalFlush(ClientContext &context, GlobalSinkState &gstate_p) const {
	auto &gstate = gstate_p.Cast<FixedBatchCopyGlobalState>();
	if (gstate.task_manager.TaskCount() != 0) {
		throw InternalException("Unexecuted tasks are remaining in PhysicalFixedBatchCopy::FinalFlush!?");
	}

	FlushBatchData(context, gstate_p);
	if (gstate.scheduled_batch_index != gstate.flushed_batch_index) {
		throw InternalException("Not all batches were flushed to disk - incomplete file?");
	}
	if (function.copy_to_finalize && gstate.global_state) {
		function.copy_to_finalize(context, *bind_data, *gstate.global_state);

		if (use_tmp_file) {
			PhysicalCopyToFile::MoveTmpFile(context, file_path);
		}
	}
	gstate.memory_manager.FinalCheck();
	return SinkFinalizeType::READY;
}